

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::update_tracker_timer(torrent *this,time_point32 now)

{
  byte bVar1;
  ushort uVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  node_ptr plVar3;
  service_type *psVar4;
  pointer __first;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  node_ptr plVar9;
  long lVar10;
  ulong uVar11;
  pointer ptVar12;
  pointer ptVar13;
  pointer __last;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer pcVar14;
  long *plVar15;
  wait_op *op;
  long lVar16;
  _Tp_alloc_type *__alloc;
  undefined8 in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  size_t __n;
  endpoint *ep;
  int iVar17;
  undefined4 in_register_00000034;
  node_ptr this_00;
  undefined8 uVar18;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
  __it;
  long lVar19;
  ulong uVar20;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
  _Var21;
  ulong uVar22;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  int local_cc;
  uint local_bc;
  vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  listen_socket_states;
  string local_98;
  scheduler_operation *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  undefined8 local_60;
  node_ptr local_58;
  node_ptr local_50;
  ulong local_48;
  ulong local_40;
  node_ptr local_38;
  
  local_60 = CONCAT44(in_register_00000034,now.__d.__r);
  if ((this->field_0x5c0 & 0x40) == 0) {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    (*UNRECOVERED_JUMPTABLE)
              (this,"*** update tracker timer: not announcing",in_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  bVar6 = info_hash_t::has_v1(&this->m_info_hash);
  bVar7 = info_hash_t::has_v2(&this->m_info_hash);
  supports_protocol.super_array<const_bool,_2UL>._M_elems[1] = bVar7;
  supports_protocol.super_array<const_bool,_2UL>._M_elems[0] = bVar6;
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar8 != '\0') {
    iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    bVar6 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar8),0x8011);
    iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    bVar7 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var_00,iVar8),0x8012);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,
               "*** update_tracker_timer: [ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
               ,(ulong)bVar6,(ulong)bVar7,
               (ulong)(uint)(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.
                            super_size_traits.size_);
  }
  plVar9 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node;
  local_bc = 0xffffffff;
  local_cc = 0x7fffffff;
  __last = (pointer)0x0;
  local_58 = plVar9;
  do {
    plVar9 = ((node *)&plVar9->next_)->next_;
    if (plVar9 == local_58) break;
    local_bc = local_bc + 1;
    this_00 = plVar9[5].next_;
    local_50 = plVar9[5].prev_;
    for (; __first = listen_socket_states.
                     super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                     ._M_impl.super__Vector_impl_data._M_start, this_00 != local_50;
        this_00 = (node_ptr)&this_00[0xc].prev_) {
      lVar19 = (long)__last -
               (long)listen_socket_states.
                     super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = 8;
      lVar10 = 0;
      for (__args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar19 >> 7); 0 < (long)__args;
          __args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&__args[-1]._M_weak_count + 3)) {
        plVar3 = this_00[0xc].next_;
        if (plVar3 == *(node_ptr *)
                       ((long)&(((timer_state *)
                                (&(listen_socket_states.
                                   super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->state + -1))->socket)
                               .m_sock.
                               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar16)) {
          ptVar12 = (pointer)((long)listen_socket_states.
                                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                    ._M_impl.super__Vector_impl_data._M_start - lVar10);
          goto LAB_002d7ce2;
        }
        if (plVar3 == *(node_ptr *)
                       ((long)&(((timer_state *)
                                (&listen_socket_states.
                                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1].state + -1))->socket)
                               .m_sock.
                               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar16)) {
          ptVar12 = (pointer)((long)listen_socket_states.
                                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (0x20 - lVar10));
          goto LAB_002d7ce2;
        }
        if (plVar3 == *(node_ptr *)
                       ((long)&(((timer_state *)
                                (&listen_socket_states.
                                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2].state + -1))->socket)
                               .m_sock.
                               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar16)) {
          ptVar12 = (pointer)((long)listen_socket_states.
                                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (0x40 - lVar10));
          goto LAB_002d7ce2;
        }
        if (plVar3 == *(node_ptr *)
                       ((long)&(((timer_state *)
                                (&listen_socket_states.
                                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                  ._M_impl.super__Vector_impl_data._M_start[3].state + -1))->socket)
                               .m_sock.
                               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar16)) {
          ptVar12 = (pointer)((long)listen_socket_states.
                                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (0x60 - lVar10));
          goto LAB_002d7ce2;
        }
        lVar10 = lVar10 + -0x80;
        lVar16 = lVar16 + 0x80;
      }
      __args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar10 + lVar19 >> 5);
      ptVar12 = (pointer)((long)listen_socket_states.
                                super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                ._M_impl.super__Vector_impl_data._M_start - lVar10);
      if (__args == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3) {
        __args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[0xc].next_;
        if (__args != *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&(((timer_state *)
                                (&(listen_socket_states.
                                   super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->state + -1))->socket)
                               .m_sock.
                               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar16)) {
          ptVar12 = (pointer)((long)listen_socket_states.
                                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (0x20 - lVar10));
          goto LAB_002d7cce;
        }
LAB_002d7ce2:
        if (ptVar12 == __last) goto LAB_002d7cf8;
      }
      else {
        if (__args == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2) {
          __args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[0xc].next_;
LAB_002d7cce:
          if (__args != (ptVar12->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
            ptVar12 = ptVar12 + 1;
            goto LAB_002d7cd8;
          }
          goto LAB_002d7ce2;
        }
        if (__args == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
          __args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[0xc].next_;
LAB_002d7cd8:
          if (__args != (ptVar12->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
            ptVar12 = __last;
          }
          goto LAB_002d7ce2;
        }
LAB_002d7cf8:
        if (__last == listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if (lVar19 == 0x7fffffffffffffe0) {
            ::std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar20 = lVar19 >> 5;
          uVar11 = uVar20;
          if (__last == listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
            uVar11 = 1;
          }
          uVar22 = uVar11 + uVar20;
          __alloc = (_Tp_alloc_type *)0x3ffffffffffffff;
          if (0x3fffffffffffffe < uVar22) {
            uVar22 = 0x3ffffffffffffff;
          }
          if (CARRY8(uVar11,uVar20)) {
            uVar22 = 0x3ffffffffffffff;
          }
          if (uVar22 == 0) {
            ptVar12 = (pointer)0x0;
          }
          else {
            ptVar12 = (pointer)operator_new(uVar22 << 5);
            __args = extraout_RDX;
          }
          ::std::
          allocator_traits<std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>>::
          construct<libtorrent::aux::(anonymous_namespace)::timer_state,libtorrent::aux::listen_socket_handle_const&>
                    ((allocator_type *)(ptVar12 + uVar20),(timer_state *)&this_00[0xb].prev_,
                     (listen_socket_handle *)__args);
          ptVar13 = ::std::
                    vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                    ::_S_relocate(__first,__last,ptVar12,__alloc);
          __last = ::std::
                   vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                   ::_S_relocate(__last,__last,ptVar13 + 1,__alloc);
          ::std::
          _Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
          ::_M_deallocate((_Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                           *)__first,
                          (pointer)((long)listen_socket_states.
                                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)__first >> 5),__n);
          listen_socket_states.
          super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
          ._M_impl.super__Vector_impl_data._M_start = ptVar12;
          listen_socket_states.
          super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = __last;
          listen_socket_states.
          super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ptVar12 + uVar22;
        }
        else {
          ::std::
          allocator_traits<std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>>::
          construct<libtorrent::aux::(anonymous_namespace)::timer_state,libtorrent::aux::listen_socket_handle_const&>
                    ((allocator_type *)__last,(timer_state *)&this_00[0xb].prev_,
                     (listen_socket_handle *)__args);
          __last = listen_socket_states.
                   super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
          listen_socket_states.
          super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = __last;
        }
        ptVar12 = __last + -1;
        listen_socket_states.
        super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
        ._M_impl.super__Vector_impl_data._M_finish = __last;
      }
      if (((ulong)this_00[0xb].next_ & 1) != 0) {
        local_38 = this_00 + 2;
        for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
          uVar11 = (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar16];
          if ((supports_protocol.super_array<const_bool,_2UL>._M_elems[uVar11] == true) &&
             ((ptVar12->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[uVar11].done == false)) {
            iVar8 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
            plVar3 = local_38;
            if ((char)iVar8 != '\0') {
              print_endpoint_abi_cxx11_(&local_98,(aux *)this_00,ep);
              local_40 = (ulong)(byte)*(undefined1 *)((long)&plVar9[6].prev_ + 4);
              local_48 = (ulong)(uint)(ptVar12->state).
                                      super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                                      ._M_elems[uVar11].tier;
              uVar2 = *(ushort *)((long)plVar3 + uVar11 * 0x48 + 0x44);
              (*(this->super_request_callback)._vptr_request_callback[7])
                        (this,
                         "*** tracker: (%d) [ep: %s ] \"%s\" [ found: %d i->tier: %d tier: %d working: %d fails: %d limit: %d upd: %d ]"
                         ,(ulong)local_bc,local_98._M_dataplus._M_p,plVar9[1].next_,
                         (ulong)(ptVar12->state).
                                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                                ._M_elems[uVar11].found_working,local_40,local_48,
                         (ulong)((uVar2 & 0x7f) == 0),(ulong)(uVar2 & 0x7f),
                         (ulong)(byte)*(undefined1 *)((long)&plVar9[6].prev_ + 5),
                         (ulong)(uVar2 >> 7 & 1));
              ::std::__cxx11::string::~string((string *)&local_98);
            }
            iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0x2e])();
            bVar6 = session_settings::get_bool
                              ((session_settings *)CONCAT44(extraout_var_01,iVar8),0x8011);
            if (bVar6) {
              iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                        _vptr_session_logger[0x2e])();
              bVar6 = session_settings::get_bool
                                ((session_settings *)CONCAT44(extraout_var_02,iVar8),0x8012);
              if (((!bVar6) &&
                  ((ptVar12->state).
                   super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                   _M_elems[uVar11].found_working == true)) &&
                 (iVar8 = (ptVar12->state).
                          super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                          ._M_elems[uVar11].tier,
                 (int)(uint)(byte)*(undefined1 *)((long)&plVar9[6].prev_ + 4) <= iVar8 &&
                 iVar8 != 0x7fffffff)) goto LAB_002d8079;
            }
            bVar1 = *(undefined1 *)((long)&plVar9[6].prev_ + 4);
            if ((ptVar12->state).
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                _M_elems[uVar11].tier < (int)(uint)bVar1) {
              iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                        _vptr_session_logger[0x2e])();
              bVar6 = session_settings::get_bool
                                ((session_settings *)CONCAT44(extraout_var_03,iVar8),0x8011);
              if (!bVar6) break;
              (ptVar12->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[uVar11].found_working = false;
              bVar1 = *(undefined1 *)((long)&plVar9[6].prev_ + 4);
            }
            (ptVar12->state).
            super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>._M_elems
            [uVar11].tier = (uint)bVar1;
            uVar2 = *(ushort *)((long)plVar3 + uVar11 * 0x48 + 0x44);
            bVar1 = *(undefined1 *)((long)&plVar9[6].prev_ + 5);
            if ((bVar1 == 0) || ((uVar2 & 0x7f) < (ushort)bVar1)) {
              if ((char)uVar2 < '\0') {
                (ptVar12->state).
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                _M_elems[uVar11].found_working = true;
                uVar2 = *(ushort *)((long)plVar3 + uVar11 * 0x48 + 0x44);
              }
              else {
                iVar8 = *(int *)((long)plVar3 + uVar11 * 0x48 + 0x30);
                iVar17 = *(int *)((long)plVar3 + uVar11 * 0x48 + 0x34);
                if (iVar17 < iVar8) {
                  iVar17 = iVar8;
                }
                if (iVar17 < local_cc) {
                  local_cc = iVar17;
                }
              }
              if ((uVar2 & 0x7f) == 0) {
                (ptVar12->state).
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                _M_elems[uVar11].found_working = true;
              }
              else if (((ptVar12->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                        ._M_elems[uVar11].found_working & 1U) == 0) goto LAB_002d8079;
              iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                        _vptr_session_logger[0x2e])();
              bVar6 = session_settings::get_bool
                                ((session_settings *)CONCAT44(extraout_var_04,iVar8),0x8012);
              if (!bVar6) {
                iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                          _vptr_session_logger[0x2e])();
                bVar6 = session_settings::get_bool
                                  ((session_settings *)CONCAT44(extraout_var_05,iVar8),0x8011);
                if (!bVar6) {
                  (ptVar12->state).
                  super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                  _M_elems[uVar11].done = true;
                }
              }
            }
          }
LAB_002d8079:
        }
      }
    }
    local_98._M_dataplus._M_p._0_2_ =
         (array<const_bool,_num_protocols,_protocol_version>)
         (array<const_bool,_num_protocols,_protocol_version>)
         supports_protocol.super_array<const_bool,_2UL>._M_elems;
    lVar10 = (long)__last -
             (long)listen_socket_states.
                   super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    __it._M_current =
         listen_socket_states.
         super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
         ._M_impl.super__Vector_impl_data._M_start;
    for (lVar16 = lVar10 >> 7; _Var21._M_current = __it._M_current, 0 < lVar16; lVar16 = lVar16 + -1
        ) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::$_2>
              ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10046:7)>
                            *)&local_98,__it);
      if (bVar6) goto LAB_002d8183;
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::$_2>
              ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10046:7)>
                            *)&local_98,__it._M_current + 1);
      _Var21._M_current = __it._M_current + 1;
      if (bVar6) goto LAB_002d8183;
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::$_2>
              ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10046:7)>
                            *)&local_98,__it._M_current + 2);
      _Var21._M_current = __it._M_current + 2;
      if (bVar6) goto LAB_002d8183;
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::$_2>
              ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10046:7)>
                            *)&local_98,__it._M_current + 3);
      _Var21._M_current = __it._M_current + 3;
      if (bVar6) goto LAB_002d8183;
      __it._M_current = __it._M_current + 4;
      lVar10 = lVar10 + -0x80;
    }
    lVar10 = lVar10 >> 5;
    if (lVar10 == 1) {
LAB_002d816f:
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::$_2>
              ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10046:7)>
                            *)&local_98,__it);
      _Var21._M_current = __it._M_current;
      if (!bVar6) {
        _Var21._M_current = __last;
      }
    }
    else if (lVar10 == 2) {
LAB_002d814b:
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::$_2>
              ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10046:7)>
                            *)&local_98,__it);
      _Var21._M_current = __it._M_current;
      if (!bVar6) {
        __it._M_current = __it._M_current + 1;
        goto LAB_002d816f;
      }
    }
    else {
      if (lVar10 != 3) break;
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::$_2>
              ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10046:7)>
                            *)&local_98,__it);
      if (!bVar6) {
        __it._M_current = __it._M_current + 1;
        goto LAB_002d814b;
      }
    }
LAB_002d8183:
  } while (_Var21._M_current != __last);
  iVar8 = (int)local_60;
  iVar17 = iVar8 + 0x3c;
  if (local_cc != 0x7fffffff) {
    iVar17 = local_cc;
  }
  if (local_cc <= iVar8) {
    iVar17 = iVar8;
  }
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,
             "*** update tracker timer: before_now: %d none_eligible: %d m_waiting_tracker: %d next_announce_in: %d"
             ,(ulong)(local_cc <= iVar8),(ulong)(iVar8 < local_cc && local_cc == 0x7fffffff),
             (ulong)(uint)(int)this->m_waiting_tracker,(ulong)(uint)(iVar17 - iVar8));
  if (this->m_waiting_tracker == '\0') {
    pcVar14 = (pointer)((long)iVar17 * 1000000000);
  }
  else {
    pcVar14 = (pointer)((long)iVar17 * 1000000000);
    if ((pointer)(this->m_tracker_timer).impl_.implementation_.expiry.__d.__r == pcVar14)
    goto LAB_002d8331;
  }
  local_98._M_dataplus._M_p = pcVar14;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_at(&this->m_tracker_timer,(time_point *)&local_98);
  this->m_waiting_tracker = this->m_waiting_tracker + '\x01';
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  psVar4 = (this->m_tracker_timer).impl_.service_;
  local_98._M_dataplus._M_p = (pointer)&local_78;
  plVar15 = (long *)__tls_get_addr(&PTR_004d3f18);
  if (*plVar15 == 0) {
    uVar18 = 0;
  }
  else {
    uVar18 = *(undefined8 *)(*plVar15 + 8);
  }
  op = (wait_op *)
       boost::asio::detail::thread_info_base::
       allocate<boost::asio::detail::thread_info_base::default_tag>(uVar18,0x68);
  _Var5._M_pi = a_Stack_70[0]._M_pi;
  (op->super_operation).next_ = (scheduler_operation *)0x0;
  (op->super_operation).func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_operation).task_result_ = 0;
  (op->ec_).val_ = 0;
  (op->ec_).failed_ = false;
  (op->ec_).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  op[1].super_operation.next_ = local_78;
  op[1].super_operation.func_ = (func_type)_Var5._M_pi;
  local_78 = (scheduler_operation *)0x0;
  local_98._M_string_length = (size_type)op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                       *)&op[1].super_operation.task_result_,
                      &(this->m_tracker_timer).impl_.executor_);
  (this->m_tracker_timer).impl_.implementation_.might_have_pending_waits = true;
  local_98.field_2._M_allocated_capacity = (size_type)op;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
            (psVar4->scheduler_,&psVar4->timer_queue_,
             &(this->m_tracker_timer).impl_.implementation_.expiry,
             &(this->m_tracker_timer).impl_.implementation_.timer_data,op);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset((ptr *)&local_98);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
LAB_002d8331:
  ::std::
  vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ::~vector(&listen_socket_states);
  return;
}

Assistant:

void torrent::update_tracker_timer(time_point32 const now)
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_announcing)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** update tracker timer: not announcing");
#endif
			return;
		}

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol{
		{
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		}};
#ifdef __clang__
#pragma clang diagnostic pop
#endif

		time_point32 next_announce = time_point32::max();

		std::vector<timer_state> listen_socket_states;

#ifndef TORRENT_DISABLE_LOGGING
		int idx = -1;
		if (should_log())
		{
			debug_log("*** update_tracker_timer: "
				"[ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
				, settings().get_bool(settings_pack::announce_to_all_tiers)
				, settings().get_bool(settings_pack::announce_to_all_trackers)
				, int(m_trackers.size()));
		}
#endif
		for (auto const& t : m_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			++idx;
#endif
			for (auto const& aep : t.endpoints)
			{
				auto aep_state_iter = std::find_if(listen_socket_states.begin(), listen_socket_states.end()
					, [&](timer_state const& s) { return s.socket == aep.socket; });
				if (aep_state_iter == listen_socket_states.end())
				{
					listen_socket_states.emplace_back(aep.socket);
					aep_state_iter = listen_socket_states.end() - 1;
				}
				timer_state& ep_state = *aep_state_iter;

				if (!aep.enabled) continue;
				for (protocol_version const ih : all_versions)
				{
					if (!supports_protocol[ih]) continue;

					auto& state = ep_state.state[ih];
					auto const& a = aep.info_hashes[ih];

					if (state.done) continue;

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("*** tracker: (%d) [ep: %s ] \"%s\" ["
							" found: %d i->tier: %d tier: %d"
							" working: %d fails: %d limit: %d upd: %d ]"
							, idx, print_endpoint(aep.local_endpoint).c_str(), t.url.c_str()
							, state.found_working, t.tier, state.tier, a.is_working()
							, a.fails, t.fail_limit, a.updating);
					}
#endif

					if (settings().get_bool(settings_pack::announce_to_all_tiers)
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& state.found_working
						&& t.tier <= state.tier
						&& state.tier != INT_MAX)
						continue;

					if (t.tier > state.tier)
					{
						if (!settings().get_bool(settings_pack::announce_to_all_tiers)) break;
						state.found_working = false;
					}
					state.tier = t.tier;
					if (a.fails >= t.fail_limit && t.fail_limit != 0) continue;
					if (a.updating)
					{
						state.found_working = true;
					}
					else
					{
						time_point32 const next_tracker_announce = std::max(a.next_announce, a.min_announce);
						if (next_tracker_announce < next_announce)
							next_announce = next_tracker_announce;
					}
					if (a.is_working()) state.found_working = true;
					if (state.found_working
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& !settings().get_bool(settings_pack::announce_to_all_tiers))
						state.done = true;
				}
			}

			if (std::all_of(listen_socket_states.begin(), listen_socket_states.end()
				, [supports_protocol](timer_state const& s) {
					for (protocol_version const ih : all_versions)
					{
						if (supports_protocol[ih] && !s.state[ih].done)
							return false;
					}
					return true;
				}))
				break;
		}

#ifndef TORRENT_DISABLE_LOGGING
		bool before_now = false;
		bool none_eligible = false;
#endif
		if (next_announce <= now)
		{
			next_announce = now;
#ifndef TORRENT_DISABLE_LOGGING
			before_now = true;
#endif
		}
		else if (next_announce == time_point32::max())
		{
			// if no tracker can be announced to, check again in a minute
			next_announce = now + minutes32(1);
#ifndef TORRENT_DISABLE_LOGGING
			none_eligible = true;
#endif
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("*** update tracker timer: "
			"before_now: %d "
			"none_eligible: %d "
			"m_waiting_tracker: %d "
			"next_announce_in: %d"
			, before_now
			, none_eligible
			, m_waiting_tracker
			, int(total_seconds(next_announce - now)));
#endif

		// don't re-issue the timer if it's the same expiration time as last time
		// if m_waiting_tracker is 0, expires_at() is undefined
		if (m_waiting_tracker && m_tracker_timer.expiry() == next_announce) return;

		m_tracker_timer.expires_at(next_announce);
		ADD_OUTSTANDING_ASYNC("tracker::on_tracker_announce");
		++m_waiting_tracker;
		m_tracker_timer.async_wait([self = shared_from_this()](error_code const& e)
			{ self->wrap(&torrent::on_tracker_announce, e); });
	}